

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase268::run(TestCase268 *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  int *piVar5;
  NullableValue<kj::Exception> *pNVar6;
  Exception *pEVar7;
  size_t size;
  anon_class_8_1_a8c68091 *extraout_RDX;
  anon_class_8_1_a8c68091 *extraout_RDX_00;
  anon_class_8_1_a8c68091 *func;
  anon_class_8_1_a8c68091 *extraout_RDX_01;
  anon_class_8_1_a8c68091 *func_00;
  bool local_c95;
  int local_c94;
  bool _kj_shouldLog_15;
  DebugExpression<unsigned_int_&> DStack_c90;
  undefined1 local_c88 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_13;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_c58;
  undefined1 local_c42;
  undefined1 local_c41;
  Type local_c40;
  Function<void_()> local_c38;
  undefined1 local_c28 [8];
  Thread thread_2;
  bool _kj_shouldLog_14;
  DebugExpression<unsigned_int_&> DStack_c08;
  undefined1 local_c00 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_12;
  Quantity<long,_kj::_::NanosecondLabel> local_bc8;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_bc0;
  undefined8 local_bb0;
  undefined8 *local_ba8;
  undefined1 local_b99;
  undefined8 local_b98;
  TimePoint start_1;
  bool _kj_shouldLog_13;
  DebugExpression<unsigned_int_&> DStack_b88;
  undefined1 local_b80 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_11;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_b50;
  undefined1 local_b3a;
  undefined1 local_b39;
  uint local_b38;
  bool local_b32;
  bool local_b31;
  uint m_4;
  bool _kj_shouldLog_12;
  bool _kj_shouldLog_11;
  ArrayPtr<const_char> local_b20;
  bool local_b0a;
  DebugExpression<bool> local_b09;
  Exception *pEStack_b08;
  DebugExpression<bool> _kjCondition_10;
  Exception *e_1;
  Maybe<kj::Exception> local_af8;
  undefined1 local_960 [8];
  NullableValue<kj::Exception> _e366;
  Function<void_()> local_7c0;
  undefined1 local_7b0 [8];
  Thread thread_1;
  undefined1 local_790 [6];
  bool _kj_shouldLog_10;
  bool _kj_shouldLog_9;
  ArrayPtr<const_char> local_780;
  bool local_76a;
  DebugExpression<bool> local_769;
  Exception *pEStack_768;
  DebugExpression<bool> _kjCondition_9;
  Exception *e;
  Maybe<kj::Exception> local_758;
  undefined1 local_5c0 [8];
  NullableValue<kj::Exception> _e353;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int_&> DStack_420;
  undefined1 local_418 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_8;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_3e8;
  undefined1 local_3d7;
  undefined1 local_3d6;
  bool local_3d5;
  int local_3d4;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int_&> DStack_3d0;
  undefined1 local_3c8 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_7;
  Quantity<long,_kj::_::NanosecondLabel> local_390;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_388;
  undefined8 local_378;
  undefined1 *local_370;
  undefined1 local_366;
  bool local_365;
  int local_364;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int_&> DStack_360;
  undefined1 local_358 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_6;
  Quantity<long,_kj::_::NanosecondLabel> local_320;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_318;
  undefined8 local_308;
  undefined1 *local_300;
  undefined1 local_2f5;
  uint local_2f4;
  undefined8 uStack_2f0;
  uint m_3;
  TimePoint start;
  int local_2e0;
  bool _kj_shouldLog_5;
  undefined1 local_2d8 [16];
  Maybe<kj::_::Mutex::Waiter_&> *local_2c8;
  undefined1 local_2c0 [8];
  DebugComparison<const_unsigned_int_&,_int> _kjCondition_5;
  bool _kj_shouldLog_4;
  DebugExpression<unsigned_int_&> DStack_290;
  undefined1 local_288 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_4;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_258;
  undefined1 local_246;
  undefined1 local_245;
  uint local_244;
  undefined1 local_240 [4];
  uint m_2;
  MutexGuarded<unsigned_int> *local_238;
  Own<kj::Thread,_std::nullptr_t> local_230;
  int local_21c;
  Iterator local_218;
  int i;
  Iterator __end2;
  Iterator __begin2;
  Range<int> *__range2;
  ArrayBuilder<kj::Own<kj::Thread,_std::nullptr_t>_> threads;
  undefined1 local_1d8 [23];
  bool local_1c1;
  int local_1c0;
  bool _kj_shouldLog_3;
  undefined1 local_1b8 [16];
  Maybe<kj::_::Mutex::Waiter_&> *local_1a8;
  undefined1 local_1a0 [8];
  DebugComparison<const_unsigned_int_&,_int> _kjCondition_3;
  bool _kj_shouldLog_2;
  DebugExpression<unsigned_int_&> DStack_170;
  undefined1 local_168 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_2;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_138;
  undefined1 local_126;
  undefined1 local_125;
  uint local_124;
  Type TStack_120;
  uint m_1;
  Function<void_()> local_118;
  undefined1 local_108 [8];
  Thread thread;
  int local_e8;
  bool _kj_shouldLog_1;
  undefined1 local_e0 [16];
  Maybe<kj::_::Mutex::Waiter_&> *local_d0;
  undefined1 local_c8 [8];
  DebugComparison<const_unsigned_int_&,_int> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int_&> DStack_98;
  undefined1 local_90 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_58;
  undefined1 local_42;
  undefined1 local_41;
  uint local_40 [2];
  uint m;
  MutexGuarded<unsigned_int> value;
  MonotonicClock *clock;
  TestCase268 *this_local;
  
  value._24_8_ = systemPreciseMonotonicClock();
  local_40[1] = 0x7b;
  MutexGuarded<unsigned_int>::MutexGuarded<int>
            ((MutexGuarded<unsigned_int> *)&m,(int *)(local_40 + 1));
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_58,&run::LONG_TIMEOUT);
  uVar2 = MutexGuarded<unsigned_int>::
          when<kj::(anonymous_namespace)::TestCase268::run()::__0,kj::(anonymous_namespace)::TestCase268::run()::__1>
                    ((MutexGuarded<unsigned_int> *)&m,&local_41,&local_42,&local_58);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_58);
  local_40[0] = uVar2;
  DStack_98 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_40);
  _kjCondition_1._36_4_ = 0x7e;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_90,
             (DebugExpression<unsigned_int&> *)&stack0xffffffffffffff68,
             (int *)&_kjCondition_1.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_90);
  if (!bVar1) {
    _kjCondition_1._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x118,ERROR,"\"failed: expected \" \"m == 126\", _kjCondition",
                 (char (*) [26])"failed: expected m == 126",
                 (DebugComparison<unsigned_int_&,_int> *)local_90);
      _kjCondition_1._35_1_ = 0;
    }
  }
  MutexGuarded<unsigned_int>::lockShared((MutexGuarded<unsigned_int> *)local_e0,&m);
  puVar4 = Locked<const_unsigned_int>::operator*((Locked<const_unsigned_int> *)local_e0);
  local_d0 = (Maybe<kj::_::Mutex::Waiter_&> *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,puVar4);
  local_e8 = 0x7c;
  kj::_::DebugExpression<unsigned_int_const&>::operator==
            ((DebugComparison<const_unsigned_int_&,_int> *)local_c8,
             (DebugExpression<unsigned_int_const&> *)&local_d0,&local_e8);
  Locked<const_unsigned_int>::~Locked((Locked<const_unsigned_int> *)local_e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c8);
  if (!bVar1) {
    thread._23_1_ = kj::_::Debug::shouldLog(ERROR);
    while (thread._23_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x11a,ERROR,"\"failed: expected \" \"*value.lockShared() == 124\", _kjCondition",
                 (char (*) [44])"failed: expected *value.lockShared() == 124",
                 (DebugComparison<const_unsigned_int_&,_int> *)local_c8);
      thread._23_1_ = 0;
    }
  }
  TStack_120.value = (MutexGuarded<unsigned_int> *)&m;
  Function<void()>::Function<kj::(anonymous_namespace)::TestCase268::run()::__2>
            ((Function<void()> *)&local_118,&stack0xfffffffffffffee0);
  Thread::Thread((Thread *)local_108,&local_118);
  Function<void_()>::~Function(&local_118);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_138,&run::LONG_TIMEOUT);
  uVar2 = MutexGuarded<unsigned_int>::
          when<kj::(anonymous_namespace)::TestCase268::run()::__3,kj::(anonymous_namespace)::TestCase268::run()::__4>
                    ((MutexGuarded<unsigned_int> *)&m,&local_125,&local_126,&local_138);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_138);
  local_124 = uVar2;
  DStack_170 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_124);
  _kjCondition_3._36_4_ = 0x144;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_168,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffe90,
             (int *)&_kjCondition_3.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_168);
  if (!bVar1) {
    _kjCondition_3._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x127,ERROR,"\"failed: expected \" \"m == 324\", _kjCondition",
                 (char (*) [26])"failed: expected m == 324",
                 (DebugComparison<unsigned_int_&,_int> *)local_168);
      _kjCondition_3._35_1_ = 0;
    }
  }
  MutexGuarded<unsigned_int>::lockShared((MutexGuarded<unsigned_int> *)local_1b8,&m);
  puVar4 = Locked<const_unsigned_int>::operator*((Locked<const_unsigned_int> *)local_1b8);
  local_1a8 = (Maybe<kj::_::Mutex::Waiter_&> *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,puVar4);
  local_1c0 = 0x142;
  kj::_::DebugExpression<unsigned_int_const&>::operator==
            ((DebugComparison<const_unsigned_int_&,_int> *)local_1a0,
             (DebugExpression<unsigned_int_const&> *)&local_1a8,&local_1c0);
  Locked<const_unsigned_int>::~Locked((Locked<const_unsigned_int> *)local_1b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a0);
  if (!bVar1) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x129,ERROR,"\"failed: expected \" \"*value.lockShared() == 322\", _kjCondition",
                 (char (*) [44])"failed: expected *value.lockShared() == 322",
                 (DebugComparison<const_unsigned_int_&,_int> *)local_1a0);
      local_1c1 = false;
    }
  }
  Thread::~Thread((Thread *)local_108);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)local_1d8,&m);
  puVar4 = Locked<unsigned_int>::operator*((Locked<unsigned_int> *)local_1d8);
  *puVar4 = 0;
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)local_1d8);
  heapArrayBuilder<kj::Own<kj::Thread,decltype(nullptr)>>
            ((ArrayBuilder<kj::Own<kj::Thread,_std::nullptr_t>_> *)&__range2,(kj *)0x64,size);
  ___end2 = (Range<int>)zeroTo<int>((char  [7])0x64);
  i = (int)Range<int>::begin((Range<int> *)&__end2);
  local_218 = Range<int>::end((Range<int> *)&__end2);
  while (bVar1 = Range<int>::Iterator::operator==((Iterator *)&i,&local_218),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    piVar5 = Range<int>::Iterator::operator*((Iterator *)&i);
    local_240 = (undefined1  [4])*piVar5;
    local_238 = (MutexGuarded<unsigned_int> *)&m;
    local_21c = (int)local_240;
    heap<kj::Thread,kj::(anonymous_namespace)::TestCase268::run()::__5>
              ((kj *)&local_230,(Type *)local_240);
    ArrayBuilder<kj::Own<kj::Thread,decltype(nullptr)>>::add<kj::Own<kj::Thread,decltype(nullptr)>>
              ((ArrayBuilder<kj::Own<kj::Thread,decltype(nullptr)>> *)&__range2,&local_230);
    Own<kj::Thread,_std::nullptr_t>::~Own(&local_230);
    Range<int>::Iterator::operator++((Iterator *)&i);
  }
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_258,&run::LONG_TIMEOUT);
  uVar2 = MutexGuarded<unsigned_int>::
          when<kj::(anonymous_namespace)::TestCase268::run()::__6,kj::(anonymous_namespace)::TestCase268::run()::__7>
                    ((MutexGuarded<unsigned_int> *)&m,&local_245,&local_246,&local_258);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_258);
  local_244 = uVar2;
  DStack_290 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_244);
  _kjCondition_5._36_4_ = 100;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_288,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffd70,
             (int *)&_kjCondition_5.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_288);
  if (!bVar1) {
    _kjCondition_5._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x13d,ERROR,"\"failed: expected \" \"m == 100\", _kjCondition",
                 (char (*) [26])"failed: expected m == 100",
                 (DebugComparison<unsigned_int_&,_int> *)local_288);
      _kjCondition_5._35_1_ = 0;
    }
  }
  MutexGuarded<unsigned_int>::lockShared((MutexGuarded<unsigned_int> *)local_2d8,&m);
  puVar4 = Locked<const_unsigned_int>::operator*((Locked<const_unsigned_int> *)local_2d8);
  local_2c8 = (Maybe<kj::_::Mutex::Waiter_&> *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,puVar4);
  local_2e0 = 0x65;
  kj::_::DebugExpression<unsigned_int_const&>::operator==
            ((DebugComparison<const_unsigned_int_&,_int> *)local_2c0,
             (DebugExpression<unsigned_int_const&> *)&local_2c8,&local_2e0);
  Locked<const_unsigned_int>::~Locked((Locked<const_unsigned_int> *)local_2d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2c0);
  if (!bVar1) {
    start.value.value._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)start.value.value._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x13f,ERROR,"\"failed: expected \" \"*value.lockShared() == 101\", _kjCondition",
                 (char (*) [44])"failed: expected *value.lockShared() == 101",
                 (DebugComparison<const_unsigned_int_&,_int> *)local_2c0);
      start.value.value._7_1_ = false;
    }
  }
  ArrayBuilder<kj::Own<kj::Thread,_std::nullptr_t>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Own<kj::Thread,_std::nullptr_t>_> *)&__range2);
  uStack_2f0 = (*(code *)**(undefined8 **)value._24_8_)();
  local_308._0_4_ = value.value;
  local_308._4_4_ = value._28_4_;
  local_300 = (undefined1 *)&stack0xfffffffffffffd10;
  local_320 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                        (10,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_318,&local_320);
  uVar3 = MutexGuarded<unsigned_int>::
          when<kj::(anonymous_namespace)::TestCase268::run()::__8,kj::(anonymous_namespace)::TestCase268::run()::__9>
                    ((MutexGuarded<unsigned_int> *)&m,&local_2f5,&local_308,&local_318);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_318);
  local_2f4 = uVar3;
  DStack_360 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2f4);
  local_364 = 0xc;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_358,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffca0,&local_364);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_358);
  if (!bVar1) {
    local_365 = kj::_::Debug::shouldLog(ERROR);
    while (local_365 != false) {
      kj::_::Debug::log<char_const(&)[25],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x14a,ERROR,"\"failed: expected \" \"m == 12\", _kjCondition",
                 (char (*) [25])"failed: expected m == 12",
                 (DebugComparison<unsigned_int_&,_int> *)local_358);
      local_365 = false;
    }
  }
  local_378._0_4_ = value.value;
  local_378._4_4_ = value._28_4_;
  local_370 = (undefined1 *)&stack0xfffffffffffffd10;
  local_390 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                        (10,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_388,&local_390);
  local_2f4 = MutexGuarded<unsigned_int>::
              when<kj::(anonymous_namespace)::TestCase268::run()::__10,kj::(anonymous_namespace)::TestCase268::run()::__11>
                        ((MutexGuarded<unsigned_int> *)&m,&local_366,&local_378,&local_388);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_388);
  DStack_3d0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2f4);
  local_3d4 = 0x22;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_3c8,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffc30,&local_3d4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c8);
  if (!bVar1) {
    local_3d5 = kj::_::Debug::shouldLog(ERROR);
    while (local_3d5 != false) {
      kj::_::Debug::log<char_const(&)[25],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x152,ERROR,"\"failed: expected \" \"m == 34\", _kjCondition",
                 (char (*) [25])"failed: expected m == 34",
                 (DebugComparison<unsigned_int_&,_int> *)local_3c8);
      local_3d5 = false;
    }
  }
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_3e8,&run::LONG_TIMEOUT);
  local_2f4 = MutexGuarded<unsigned_int>::
              when<kj::(anonymous_namespace)::TestCase268::run()::__12,kj::(anonymous_namespace)::TestCase268::run()::__13>
                        ((MutexGuarded<unsigned_int> *)&m,&local_3d6,&local_3d7,&local_3e8);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_3e8);
  DStack_420 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2f4);
  _e353.field_1._396_4_ = 0x38;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_418,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffbe0,
             (int *)((long)&_e353.field_1 + 0x18c));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_418);
  func = extraout_RDX;
  if (!bVar1) {
    _e353.field_1._395_1_ = kj::_::Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (_e353.field_1._395_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[25],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x158,ERROR,"\"failed: expected \" \"m == 56\", _kjCondition",
                 (char (*) [25])"failed: expected m == 56",
                 (DebugComparison<unsigned_int_&,_int> *)local_418);
      func = extraout_RDX_01;
      _e353.field_1._395_1_ = 0;
    }
  }
  e = (Exception *)&m;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase268::run()::__14>
            (&local_758,(kj *)&e,func);
  pNVar6 = kj::_::readMaybe<kj::Exception>(&local_758);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_5c0,pNVar6);
  Maybe<kj::Exception>::~Maybe(&local_758);
  pEVar7 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_5c0);
  if (pEVar7 == (Exception *)0x0) {
    thread_1._22_1_ = kj::_::Debug::shouldLog(ERROR);
    while (thread_1._22_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[154]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x161,ERROR,
                 "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\\\"oops threw\\\"); }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
                 ,(char (*) [154])
                  "code did not throw: value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\"oops threw\"); }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
                );
      thread_1._22_1_ = 0;
    }
  }
  else {
    pEStack_768 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_5c0);
    local_780 = (ArrayPtr<const_char>)Exception::getDescription(pEStack_768);
    StringPtr::StringPtr((StringPtr *)local_790,"oops threw");
    local_76a = StringPtr::contains((StringPtr *)&local_780,(StringPtr *)local_790);
    local_769 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_76a);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_769);
    if (!bVar1) {
      thread_1._23_1_ = kj::_::Debug::shouldLog(ERROR);
      while (thread_1._23_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[59],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                   ,0x161,ERROR,
                   "\"failed: expected \" \"e.getDescription().contains(\\\"oops threw\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                   ,(char (*) [59])"failed: expected e.getDescription().contains(\"oops threw\")",
                   &local_769,
                   (char (*) [56])"exception description didn\'t contain expected substring",
                   pEStack_768);
        thread_1._23_1_ = 0;
      }
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_5c0);
  _e366.field_1.value.details.builder.disposer = (ArrayDisposer *)&m;
  Function<void()>::Function<kj::(anonymous_namespace)::TestCase268::run()::__15>
            ((Function<void()> *)&local_7c0,(Type *)&_e366.field_1.value.details.builder.disposer);
  Thread::Thread((Thread *)local_7b0,&local_7c0);
  Function<void_()>::~Function(&local_7c0);
  e_1 = (Exception *)&m;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase268::run()::__16>
            (&local_af8,(kj *)&e_1,func_00);
  pNVar6 = kj::_::readMaybe<kj::Exception>(&local_af8);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_960,pNVar6);
  Maybe<kj::Exception>::~Maybe(&local_af8);
  pEVar7 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_960);
  if (pEVar7 == (Exception *)0x0) {
    local_b32 = kj::_::Debug::shouldLog(ERROR);
    while (local_b32 != false) {
      kj::_::Debug::log<char_const(&)[173]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x16e,ERROR,
                 "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \\\"oops threw\\\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
                 ,(char (*) [173])
                  "code did not throw: value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \"oops threw\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
                );
      local_b32 = false;
    }
  }
  else {
    pEStack_b08 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_960);
    local_b20 = (ArrayPtr<const_char>)Exception::getDescription(pEStack_b08);
    StringPtr::StringPtr((StringPtr *)&m_4,"oops threw");
    local_b0a = StringPtr::contains((StringPtr *)&local_b20,(StringPtr *)&m_4);
    local_b09 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b0a);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_b09);
    if (!bVar1) {
      local_b31 = kj::_::Debug::shouldLog(ERROR);
      while (local_b31 != false) {
        kj::_::Debug::
        log<char_const(&)[59],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                   ,0x16e,ERROR,
                   "\"failed: expected \" \"e.getDescription().contains(\\\"oops threw\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                   ,(char (*) [59])"failed: expected e.getDescription().contains(\"oops threw\")",
                   &local_b09,
                   (char (*) [56])"exception description didn\'t contain expected substring",
                   pEStack_b08);
        local_b31 = false;
      }
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_960);
  Thread::~Thread((Thread *)local_7b0);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_b50,&run::LONG_TIMEOUT);
  uVar2 = MutexGuarded<unsigned_int>::
          when<kj::(anonymous_namespace)::TestCase268::run()::__17,kj::(anonymous_namespace)::TestCase268::run()::__18>
                    ((MutexGuarded<unsigned_int> *)&m,&local_b39,&local_b3a,&local_b50);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_b50);
  local_b38 = uVar2;
  DStack_b88 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b38);
  start_1.value.value._4_4_ = 0x141;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_b80,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffff478,
             (int *)((long)&start_1.value.value + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b80);
  if (!bVar1) {
    start_1.value.value._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)start_1.value.value._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x176,ERROR,"\"failed: expected \" \"m == 321\", _kjCondition",
                 (char (*) [26])"failed: expected m == 321",
                 (DebugComparison<unsigned_int_&,_int> *)local_b80);
      start_1.value.value._3_1_ = false;
    }
  }
  local_b98 = (*(code *)**(undefined8 **)value._24_8_)();
  local_bb0._0_4_ = value.value;
  local_bb0._4_4_ = value._28_4_;
  local_ba8 = &local_b98;
  local_bc8 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                        (10,(Quantity<long,_kj::_::NanosecondLabel>)0xf4240);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_bc0,&local_bc8);
  local_b38 = MutexGuarded<unsigned_int>::
              when<kj::(anonymous_namespace)::TestCase268::run()::__19,kj::(anonymous_namespace)::TestCase268::run()::__20>
                        ((MutexGuarded<unsigned_int> *)&m,&local_b99,&local_bb0,&local_bc0);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_bc0);
  DStack_c08 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b38);
  thread_2._20_4_ = 0x142;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_c00,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffff3f8,(int *)&thread_2.field_0x14)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c00);
  if (!bVar1) {
    thread_2._19_1_ = kj::_::Debug::shouldLog(ERROR);
    while (thread_2._19_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x17d,ERROR,"\"failed: expected \" \"m == 322\", _kjCondition",
                 (char (*) [26])"failed: expected m == 322",
                 (DebugComparison<unsigned_int_&,_int> *)local_c00);
      thread_2._19_1_ = 0;
    }
  }
  local_c40.value = (MutexGuarded<unsigned_int> *)&m;
  Function<void()>::Function<kj::(anonymous_namespace)::TestCase268::run()::__21>
            ((Function<void()> *)&local_c38,&local_c40);
  Thread::Thread((Thread *)local_c28,&local_c38);
  Function<void_()>::~Function(&local_c38);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_c58,&run::LONG_TIMEOUT);
  local_b38 = MutexGuarded<unsigned_int>::
              when<kj::(anonymous_namespace)::TestCase268::run()::__22,kj::(anonymous_namespace)::TestCase268::run()::__23>
                        ((MutexGuarded<unsigned_int> *)&m,&local_c41,&local_c42,&local_c58);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_c58);
  DStack_c90 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b38);
  local_c94 = 0x28e;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_c88,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffff370,&local_c94);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c88);
  if (!bVar1) {
    local_c95 = kj::_::Debug::shouldLog(ERROR);
    while (local_c95 != false) {
      kj::_::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x187,ERROR,"\"failed: expected \" \"m == 654\", _kjCondition",
                 (char (*) [26])"failed: expected m == 654",
                 (DebugComparison<unsigned_int_&,_int> *)local_c88);
      local_c95 = false;
    }
  }
  Thread::~Thread((Thread *)local_c28);
  MutexGuarded<unsigned_int>::~MutexGuarded((MutexGuarded<unsigned_int> *)&m);
  return;
}

Assistant:

TEST(Mutex, WhenWithTimeout) {
  auto& clock = systemPreciseMonotonicClock();
  MutexGuarded<uint> value(123);

  // A timeout that won't expire.
  static constexpr Duration LONG_TIMEOUT = 10 * kj::SECONDS;

  {
    uint m = value.when([](uint n) { return n < 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 126);

    KJ_EXPECT(*value.lockShared() == 124);
  }

  {
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    uint m = value.when([](uint n) { return n > 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 324);

    KJ_EXPECT(*value.lockShared() == 322);
  }

  {
    // Stress test. 100 threads each wait for a value and then set the next value.
    *value.lockExclusive() = 0;

    auto threads = kj::heapArrayBuilder<kj::Own<kj::Thread>>(100);
    for (auto i: kj::zeroTo(100)) {
      threads.add(kj::heap<kj::Thread>([i,&value]() {
        if (i % 2 == 0) delay();
        uint m = value.when([i](const uint& n) { return n == i; },
            [](uint& n) { return n++; }, LONG_TIMEOUT);
        KJ_ASSERT(m == i);
      }));
    }

    uint m = value.when([](uint n) { return n == 100; }, [](uint& n) {
      return n++;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 100);

    KJ_EXPECT(*value.lockShared() == 101);
  }

  {
    auto start = clock.now();
    uint m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 10 * kj::MILLISECONDS, t);
      return 12;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 12);

    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 20 * kj::MILLISECONDS, t);
      return 34;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 34);

    m = value.when([](uint n) { return n > 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      return 56;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 56);
  }

  {
    // Throw from predicate.
    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_FAIL_ASSERT("oops threw");
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));

    // Throw from predicate later on.
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_ASSERT(n != 321, "oops threw");
      return false;
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));
  }

  {
    // Verify the exceptions didn't break the mutex.
    uint m = value.when([](uint n) { return n > 0; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 321);

    auto start = clock.now();
    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_EXPECT(clock.now() - start >= 10 * kj::MILLISECONDS);
      return n + 1;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 322);

    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 654;
    });

    m = value.when([](uint n) { return n > 500; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 654);
  }
}